

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

void y4m_42xmpeg2_42xjpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  if (0 < _c_h) {
    uVar1 = 2;
    if (_c_w < 2) {
      uVar1 = (ulong)(uint)_c_w;
    }
    iVar6 = _c_w + -1;
    lVar4 = (long)_c_w;
    iVar3 = 0;
    do {
      uVar9 = 0;
      if (0 < _c_w) {
        uVar7 = 0;
        do {
          uVar9 = uVar7 + 1;
          iVar5 = iVar6;
          if ((int)uVar9 < iVar6) {
            iVar5 = (int)uVar9;
          }
          iVar2 = (int)uVar7 + 2;
          if (iVar6 <= iVar2) {
            iVar2 = iVar6;
          }
          iVar8 = (int)uVar7 + 3;
          if (iVar6 <= iVar8) {
            iVar8 = iVar6;
          }
          iVar5 = (int)((uint)_src[iVar8] +
                        (((uint)_src[uVar7] * 0x72 + (uint)*_src * -0xd + (uint)_src[iVar5] * 0x23)
                        - ((uint)_src[iVar2] + (uint)_src[iVar2] * 8)) + 0x40) >> 7;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          _dst[uVar7] = (uchar)iVar5;
          uVar7 = uVar9;
        } while (uVar1 != uVar9);
      }
      if ((int)uVar9 < (int)(_c_w - 3U)) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          iVar5 = (int)((((uint)_src[uVar9 + 1] * 0x23 +
                         (uint)_src[uVar9] * 0x72 +
                         ((uint)_src[uVar9 - 2] * 4 -
                         ((uint)_src[uVar9 - 1] * 0x10 + (uint)_src[uVar9 - 1]))) -
                        ((uint)_src[uVar9 + 2] + (uint)_src[uVar9 + 2] * 8)) + (uint)_src[uVar9 + 3]
                       + 0x40) >> 7;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          _dst[uVar9] = (uchar)iVar5;
          uVar9 = uVar9 + 1;
        } while (_c_w - 3U != uVar9);
      }
      if ((int)uVar9 < _c_w) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          uVar7 = uVar9 + 1;
          iVar2 = (int)(lVar4 + -1);
          iVar5 = iVar2;
          if ((int)uVar7 < iVar2) {
            iVar5 = (int)uVar7;
          }
          iVar8 = (int)uVar9 + 2;
          if (iVar2 <= iVar8) {
            iVar8 = iVar2;
          }
          iVar5 = (int)((uint)_src[lVar4 + -1] +
                        (((uint)_src[uVar9 - 2] * 4 + (uint)_src[uVar9 - 1] * -0x11 +
                          (uint)_src[uVar9] * 0x72 + (uint)_src[iVar5] * 0x23) -
                        ((uint)_src[iVar8] + (uint)_src[iVar8] * 8)) + 0x40) >> 7;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          _dst[uVar9] = (uchar)iVar5;
          uVar9 = uVar7;
        } while ((uint)_c_w != uVar7);
      }
      _dst = _dst + lVar4;
      _src = _src + lVar4;
      iVar3 = iVar3 + 1;
    } while (iVar3 != _c_h);
  }
  return;
}

Assistant:

static void y4m_42xmpeg2_42xjpeg_helper(unsigned char *_dst,
                                        const unsigned char *_src, int _c_w,
                                        int _c_h) {
  int y;
  int x;
  for (y = 0; y < _c_h; y++) {
    /*Filter: [4 -17 114 35 -9 1]/128, derived from a 6-tap Lanczos
       window.*/
    for (x = 0; x < OC_MINI(_c_w, 2); x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[0] - 17 * _src[OC_MAXI(x - 1, 0)] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[OC_MINI(x + 3, _c_w - 1)] +
           64) >>
              7,
          255);
    }
    for (; x < _c_w - 3; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[x + 1] - 9 * _src[x + 2] + _src[x + 3] + 64) >>
              7,
          255);
    }
    for (; x < _c_w; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[_c_w - 1] + 64) >>
              7,
          255);
    }
    _dst += _c_w;
    _src += _c_w;
  }
}